

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

size_t __thiscall
anon_unknown.dwarf_33061f::t_debugger::f_read_integer(t_debugger *this,wint_t *a_c)

{
  int iVar1;
  wint_t __wc;
  size_t sVar2;
  
  iVar1 = iswdigit(*(wint_t *)&(this->super_t_debugger)._vptr_t_debugger);
  sVar2 = 0;
  while (iVar1 != 0) {
    sVar2 = (ulong)(*(int *)&(this->super_t_debugger)._vptr_t_debugger - 0x30) + sVar2 * 10;
    __wc = getwchar();
    *(wint_t *)&(this->super_t_debugger)._vptr_t_debugger = __wc;
    iVar1 = iswdigit(__wc);
  }
  return sVar2;
}

Assistant:

size_t f_read_integer(wint_t& a_c)
	{
		size_t i = 0;
		while (std::iswdigit(a_c)) {
			i = i * 10 + (a_c - L'0');
			a_c = std::getwchar();
		}
		return i;
	}